

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O0

void __thiscall xmrig::App::onSignal(App *this,int signum)

{
  int in_ESI;
  int __fd;
  App *in_RDI;
  
  if (in_ESI == 1) {
    __fd = 0x27eb9d;
    Log::print(WARNING);
  }
  else if (in_ESI == 2) {
    __fd = 0x27ebd0;
    Log::print(WARNING);
  }
  else {
    if (in_ESI != 0xf) {
      return;
    }
    __fd = 0x27ebb6;
    Log::print(WARNING);
  }
  close(in_RDI,__fd);
  return;
}

Assistant:

void xmrig::App::onSignal(int signum)
{
    switch (signum)
    {
    case SIGHUP:
        LOG_WARN("SIGHUP received, exiting");
        break;

    case SIGTERM:
        LOG_WARN("SIGTERM received, exiting");
        break;

    case SIGINT:
        LOG_WARN("SIGINT received, exiting");
        break;

    default:
        return;
    }

    close();
}